

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdi::ControlContainer::~ControlContainer(ControlContainer *this)

{
  QPointer<QWidget> *pQVar1;
  QPointer<QWidget> *pQVar2;
  QObject *pQVar3;
  Data *pDVar4;
  
  *(undefined ***)this = &PTR_metaObject_007f6448;
  removeButtonsFromMenuBar(this,(QMenuBar *)0x0);
  pQVar1 = &this->m_menuLabel;
  pDVar4 = (this->m_menuLabel).wp.d;
  if (pDVar4 == (Data *)0x0) {
    (pQVar1->wp).d = (Data *)0x0;
    (this->m_menuLabel).wp.value = (QObject *)0x0;
  }
  else {
    if ((*(int *)(pDVar4 + 4) == 0) ||
       (pQVar3 = (this->m_menuLabel).wp.value, pQVar3 == (QObject *)0x0)) {
      (pQVar1->wp).d = (Data *)0x0;
      (this->m_menuLabel).wp.value = (QObject *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x20))(pQVar3);
      pDVar4 = (pQVar1->wp).d;
      (pQVar1->wp).d = (Data *)0x0;
      (this->m_menuLabel).wp.value = (QObject *)0x0;
      if (pDVar4 == (Data *)0x0) goto LAB_00449d34;
    }
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      operator_delete(pDVar4);
    }
  }
LAB_00449d34:
  pQVar2 = &this->m_controllerWidget;
  pDVar4 = (this->m_controllerWidget).wp.d;
  if (pDVar4 == (Data *)0x0) {
    (pQVar2->wp).d = (Data *)0x0;
    (this->m_controllerWidget).wp.value = (QObject *)0x0;
  }
  else {
    if ((*(int *)(pDVar4 + 4) == 0) ||
       (pQVar3 = (this->m_controllerWidget).wp.value, pQVar3 == (QObject *)0x0)) {
      (pQVar2->wp).d = (Data *)0x0;
      (this->m_controllerWidget).wp.value = (QObject *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x20))(pQVar3);
      pDVar4 = (pQVar2->wp).d;
      (pQVar2->wp).d = (Data *)0x0;
      (this->m_controllerWidget).wp.value = (QObject *)0x0;
      if (pDVar4 == (Data *)0x0) goto LAB_00449d85;
    }
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      operator_delete(pDVar4);
    }
  }
LAB_00449d85:
  pDVar4 = (this->mdiChild).wp.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      pDVar4 = (this->mdiChild).wp.d;
      if (pDVar4 == (Data *)0x0) {
        pDVar4 = (Data *)0x0;
      }
      operator_delete(pDVar4);
    }
  }
  pDVar4 = (pQVar1->wp).d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      pDVar4 = (pQVar1->wp).d;
      if (pDVar4 == (Data *)0x0) {
        pDVar4 = (Data *)0x0;
      }
      operator_delete(pDVar4);
    }
  }
  pDVar4 = (pQVar2->wp).d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      pDVar4 = (pQVar2->wp).d;
      if (pDVar4 == (Data *)0x0) {
        pDVar4 = (Data *)0x0;
      }
      operator_delete(pDVar4);
    }
  }
  pDVar4 = (this->m_menuBar).wp.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      pDVar4 = (this->m_menuBar).wp.d;
      if (pDVar4 == (Data *)0x0) {
        pDVar4 = (Data *)0x0;
      }
      operator_delete(pDVar4);
    }
  }
  pDVar4 = (this->previousRight).wp.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      pDVar4 = (this->previousRight).wp.d;
      if (pDVar4 == (Data *)0x0) {
        pDVar4 = (Data *)0x0;
      }
      operator_delete(pDVar4);
    }
  }
  pDVar4 = (this->previousLeft).wp.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar4 = *(int *)pDVar4 + -1;
    UNLOCK();
    if (*(int *)pDVar4 == 0) {
      pDVar4 = (this->previousLeft).wp.d;
      if (pDVar4 == (Data *)0x0) {
        pDVar4 = (Data *)0x0;
      }
      operator_delete(pDVar4);
    }
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

ControlContainer::~ControlContainer()
{
#if QT_CONFIG(menubar)
    removeButtonsFromMenuBar();
#endif
    delete m_menuLabel;
    m_menuLabel = nullptr;
    delete m_controllerWidget;
    m_controllerWidget = nullptr;
}